

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_getoff_all_pipelines(Curl_easy *data,connectdata *conn)

{
  int iVar1;
  _Bool local_1c;
  _Bool local_1b;
  _Bool send_head;
  _Bool recv_head;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (conn->bundle != (connectbundle *)0x0) {
    if (conn->bundle->multiuse == 1) {
      local_1b = false;
      if ((conn->readchannel_inuse & 1U) != 0) {
        local_1b = Curl_recvpipe_head(data,conn);
      }
      local_1c = false;
      if ((conn->writechannel_inuse & 1U) != 0) {
        local_1c = Curl_sendpipe_head(data,conn);
      }
      iVar1 = Curl_removeHandleFromPipeline(data,&conn->recv_pipe);
      if ((iVar1 != 0) && (local_1b != false)) {
        Curl_pipeline_leave_read(conn);
      }
      iVar1 = Curl_removeHandleFromPipeline(data,&conn->send_pipe);
      if ((iVar1 != 0) && (local_1c != false)) {
        Curl_pipeline_leave_write(conn);
      }
    }
    else {
      Curl_removeHandleFromPipeline(data,&conn->recv_pipe);
      Curl_removeHandleFromPipeline(data,&conn->send_pipe);
    }
  }
  return;
}

Assistant:

void Curl_getoff_all_pipelines(struct Curl_easy *data,
                               struct connectdata *conn)
{
  if(!conn->bundle)
    return;
  if(conn->bundle->multiuse == BUNDLE_PIPELINING) {
    bool recv_head = (conn->readchannel_inuse &&
                      Curl_recvpipe_head(data, conn));
    bool send_head = (conn->writechannel_inuse &&
                      Curl_sendpipe_head(data, conn));

    if(Curl_removeHandleFromPipeline(data, &conn->recv_pipe) && recv_head)
      Curl_pipeline_leave_read(conn);
    if(Curl_removeHandleFromPipeline(data, &conn->send_pipe) && send_head)
      Curl_pipeline_leave_write(conn);
  }
  else {
    (void)Curl_removeHandleFromPipeline(data, &conn->recv_pipe);
    (void)Curl_removeHandleFromPipeline(data, &conn->send_pipe);
  }
}